

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O3

size_t avx2_despace_branchless(char *bytes,size_t howmany)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  
  if (howmany < 0x20) {
    uVar12 = 0;
    sVar10 = 0;
  }
  else {
    auVar15[8] = 0x20;
    auVar15._0_8_ = 0x2020202020202020;
    auVar15[9] = 0x20;
    auVar15[10] = 0x20;
    auVar15[0xb] = 0x20;
    auVar15[0xc] = 0x20;
    auVar15[0xd] = 0x20;
    auVar15[0xe] = 0x20;
    auVar15[0xf] = 0x20;
    auVar15[0x10] = 0x20;
    auVar15[0x11] = 0x20;
    auVar15[0x12] = 0x20;
    auVar15[0x13] = 0x20;
    auVar15[0x14] = 0x20;
    auVar15[0x15] = 0x20;
    auVar15[0x16] = 0x20;
    auVar15[0x17] = 0x20;
    auVar15[0x18] = 0x20;
    auVar15[0x19] = 0x20;
    auVar15[0x1a] = 0x20;
    auVar15[0x1b] = 0x20;
    auVar15[0x1c] = 0x20;
    auVar15[0x1d] = 0x20;
    auVar15[0x1e] = 0x20;
    auVar15[0x1f] = 0x20;
    auVar17[8] = 10;
    auVar17._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar17[9] = 10;
    auVar17[10] = 10;
    auVar17[0xb] = 10;
    auVar17[0xc] = 10;
    auVar17[0xd] = 10;
    auVar17[0xe] = 10;
    auVar17[0xf] = 10;
    auVar17[0x10] = 10;
    auVar17[0x11] = 10;
    auVar17[0x12] = 10;
    auVar17[0x13] = 10;
    auVar17[0x14] = 10;
    auVar17[0x15] = 10;
    auVar17[0x16] = 10;
    auVar17[0x17] = 10;
    auVar17[0x18] = 10;
    auVar17[0x19] = 10;
    auVar17[0x1a] = 10;
    auVar17[0x1b] = 10;
    auVar17[0x1c] = 10;
    auVar17[0x1d] = 10;
    auVar17[0x1e] = 10;
    auVar17[0x1f] = 10;
    auVar19[8] = 0xd;
    auVar19._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar19[9] = 0xd;
    auVar19[10] = 0xd;
    auVar19[0xb] = 0xd;
    auVar19[0xc] = 0xd;
    auVar19[0xd] = 0xd;
    auVar19[0xe] = 0xd;
    auVar19[0xf] = 0xd;
    auVar19[0x10] = 0xd;
    auVar19[0x11] = 0xd;
    auVar19[0x12] = 0xd;
    auVar19[0x13] = 0xd;
    auVar19[0x14] = 0xd;
    auVar19[0x15] = 0xd;
    auVar19[0x16] = 0xd;
    auVar19[0x17] = 0xd;
    auVar19[0x18] = 0xd;
    auVar19[0x19] = 0xd;
    auVar19[0x1a] = 0xd;
    auVar19[0x1b] = 0xd;
    auVar19[0x1c] = 0xd;
    auVar19[0x1d] = 0xd;
    auVar19[0x1e] = 0xd;
    auVar19[0x1f] = 0xd;
    sVar10 = 0;
    uVar8 = 0;
    do {
      auVar2 = *(undefined1 (*) [32])(bytes + uVar8);
      uVar12 = uVar8 + 0x20;
      uVar13 = uVar8 + 0x3f;
      uVar4 = vpcmpeqb_avx512vl(auVar2,auVar15);
      uVar5 = vpcmpeqb_avx512vl(auVar2,auVar17);
      uVar6 = vpcmpeqb_avx512vl(auVar2,auVar19);
      uVar7 = (uint)uVar5 | (uint)uVar4 | (uint)uVar6;
      auVar20._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])("" + (uVar7 >> 0xc & 0x7fff0)) +
           ZEXT116(1) * *(undefined1 (*) [16])("" + ((uVar7 & 0x7fff) << 4));
      auVar20._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])("" + (uVar7 >> 0xc & 0x7fff0));
      lVar9 = 0x10 - (ulong)(uint)POPCOUNT(uVar7 & 0xffff);
      auVar2 = vpshufb_avx2(auVar2,auVar20);
      *(undefined1 (*) [16])(bytes + sVar10) = auVar2._0_16_;
      *(undefined1 (*) [16])(bytes + lVar9 + sVar10) = auVar2._16_16_;
      sVar10 = (((int)lVar9 - POPCOUNT(uVar7 >> 0x10)) + 0x10) + sVar10;
      uVar8 = uVar12;
    } while (uVar13 < howmany);
  }
  if ((uVar12 | 0xf) < howmany) {
    auVar14[8] = 0x20;
    auVar14._0_8_ = 0x2020202020202020;
    auVar14[9] = 0x20;
    auVar14[10] = 0x20;
    auVar14[0xb] = 0x20;
    auVar14[0xc] = 0x20;
    auVar14[0xd] = 0x20;
    auVar14[0xe] = 0x20;
    auVar14[0xf] = 0x20;
    auVar16[8] = 10;
    auVar16._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar16[9] = 10;
    auVar16[10] = 10;
    auVar16[0xb] = 10;
    auVar16[0xc] = 10;
    auVar16[0xd] = 10;
    auVar16[0xe] = 10;
    auVar16[0xf] = 10;
    auVar18[8] = 0xd;
    auVar18._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar18[9] = 0xd;
    auVar18[10] = 0xd;
    auVar18[0xb] = 0xd;
    auVar18[0xc] = 0xd;
    auVar18[0xd] = 0xd;
    auVar18[0xe] = 0xd;
    auVar18[0xf] = 0xd;
    uVar8 = uVar12;
    sVar11 = sVar10;
    do {
      auVar1 = *(undefined1 (*) [16])(bytes + uVar8);
      uVar12 = uVar8 + 0x10;
      uVar13 = uVar8 + 0x1f;
      uVar4 = vpcmpeqb_avx512vl(auVar1,auVar14);
      uVar5 = vpcmpeqb_avx512vl(auVar1,auVar16);
      uVar6 = vpcmpeqb_avx512vl(auVar1,auVar18);
      uVar7 = (uint)(ushort)((ushort)uVar5 | (ushort)uVar4 | (ushort)uVar6);
      auVar1 = vpshufb_avx(auVar1,*(undefined1 (*) [16])("" + ((uVar7 & 0x7fff) << 4)));
      sVar10 = (0x10 - POPCOUNT(uVar7)) + sVar11;
      *(undefined1 (*) [16])(bytes + sVar11) = auVar1;
      uVar8 = uVar12;
      sVar11 = sVar10;
    } while (uVar13 < howmany);
  }
  if (uVar12 < howmany) {
    do {
      bVar3 = bytes[uVar12];
      if ((0x20 < (ulong)bVar3) || ((0x100002400U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
        bytes[sVar10] = bVar3;
        sVar10 = sVar10 + 1;
      }
      uVar12 = uVar12 + 1;
    } while (howmany != uVar12);
  }
  return sVar10;
}

Assistant:

size_t avx2_despace_branchless(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');

  __m256i spaces256 = _mm256_set1_epi8(' ');
  __m256i newline256 = _mm256_set1_epi8('\n');
  __m256i carriage256 = _mm256_set1_epi8('\r');

  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m256i x = _mm256_loadu_si256((const __m256i *)(bytes + i));
    unsigned int masklow, maskhigh;
    x = cleanm256(x, spaces256, newline256, carriage256, &masklow, &maskhigh);
    int offset1 = 16 - _mm_popcnt_u32(masklow);
    int offset2 = 16 - _mm_popcnt_u32(maskhigh);
    _mm256_storeu2_m128i((__m128i *)(bytes + pos + offset1),
                         (__m128i *)(bytes + pos), x);
    pos += offset1 + offset2;
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = cleanm128(x, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}